

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

bool slang::caseZWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  uint uVar1;
  SVInt *pSVar2;
  SVInt *pSVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  
  bVar6 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar6 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar6 = exactlyEqual(lhs,rhs);
    return bVar6;
  }
  uVar1 = (lhs->super_SVIntStorage).bitWidth;
  uVar8 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar1 == uVar8) {
    bVar7 = true;
    if (0x3f < uVar1 + 0x3f) {
      uVar8 = uVar1 + 0x3f >> 6;
      pSVar2 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      bVar7 = (rhs->super_SVIntStorage).unknownFlag;
      if (bVar6 != false) {
        lhs = pSVar2;
      }
      pSVar3 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
      if (bVar7 != false) {
        rhs = pSVar3;
      }
      if (0x40 < uVar1) {
        rhs = pSVar3;
        lhs = pSVar2;
      }
      uVar10 = (ulong)(uVar8 << 3);
      uVar11 = 0;
      do {
        if (bVar6 == false) {
          uVar12 = 0xffffffffffffffff;
          uVar14 = 0;
        }
        else {
          uVar12 = *(ulong *)((long)&(pSVar2->super_SVIntStorage).field_0 + uVar11 * 8 + uVar10);
          uVar13 = (&(pSVar2->super_SVIntStorage).field_0)[uVar11].val;
          uVar14 = ~uVar13 & uVar12;
          uVar12 = ~(uVar13 & uVar12);
        }
        if (bVar7 == false) {
          uVar13 = 0;
        }
        else {
          uVar4 = *(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 + uVar11 * 8 + uVar10);
          uVar5 = (&(pSVar3->super_SVIntStorage).field_0)[uVar11].val;
          uVar13 = ~uVar5 & uVar4;
          uVar12 = uVar12 & ~(uVar5 & uVar4);
        }
        if (((((&(rhs->super_SVIntStorage).field_0)[uVar11].val ^
              (&(lhs->super_SVIntStorage).field_0)[uVar11].val) & uVar12) != 0) ||
           (((uVar13 ^ uVar14) & uVar12) != 0)) {
          return false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      bVar7 = true;
    }
  }
  else {
    bVar9 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar1 < uVar8) {
      if (bVar9 == 0) {
        SVInt::zext((SVInt *)&local_40,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_40,(bitwidth_t)lhs);
      }
      bVar7 = caseZWildcardEqual((SVInt *)&local_40,rhs);
    }
    else {
      if (bVar9 == 0) {
        SVInt::zext((SVInt *)&local_40,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_40,(bitwidth_t)rhs);
      }
      bVar7 = caseZWildcardEqual(lhs,(SVInt *)&local_40);
    }
    if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
  }
  return bVar7;
}

Assistant:

bool caseZWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseZWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseZWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the Z bits on either side
        uint64_t mask = UINT64_MAX;

        uint64_t lunknown = 0;
        if (lhs.unknownFlag) {
            lunknown = lhs.pVal[i + words] & ~lhs.pVal[i];
            mask &= ~(lhs.pVal[i + words] & lhs.pVal[i]);
        }

        uint64_t runknown = 0;
        if (rhs.unknownFlag) {
            runknown = rhs.pVal[i + words] & ~rhs.pVal[i];
            mask &= ~(rhs.pVal[i + words] & rhs.pVal[i]);
        }

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask) ||
            (lunknown & mask) != (runknown & mask)) {
            return false;
        }
    }

    return true;
}